

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qppmhandler.cpp
# Opt level: O2

ssize_t __thiscall QPpmHandler::read(QPpmHandler *this,int __fd,void *__buf,size_t __nbytes)

{
  uint *puVar1;
  byte bVar2;
  uint uVar3;
  QSize size;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  QRgb QVar12;
  QIODevice *d;
  uchar *puVar13;
  byte *pbVar14;
  ulong uVar15;
  uint *puVar16;
  ushort *puVar17;
  uchar *puVar18;
  uchar *puVar19;
  uchar *puVar20;
  ushort gv;
  qsizetype i;
  long lVar21;
  uint uVar22;
  State SVar23;
  long lVar24;
  byte *pbVar25;
  int i_1;
  int iVar26;
  int iVar27;
  Format format;
  undefined4 in_register_00000034;
  QImage *image;
  ushort bv;
  ulong uVar28;
  ushort *puVar29;
  int bitsLeft;
  int i_00;
  uchar *puVar30;
  long in_FS_OFFSET;
  quint16 local_98;
  byte local_94;
  QRgba64 local_40;
  long local_38;
  
  image = (QImage *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->state == Error) {
    uVar28 = 0;
    goto LAB_00296841;
  }
  SVar23 = Error;
  if ((this->state != Ready) || (bVar5 = readHeader(this), bVar5)) {
    d = QImageIOHandler::device(&this->super_QImageIOHandler);
    bVar2 = this->type;
    uVar28 = (ulong)bVar2;
    if (uVar28 < 0x37) {
      iVar26 = this->width;
      iVar7 = this->height;
      size.wd.m_i = this->width;
      size.ht.m_i = this->height;
      uVar3 = this->mcc;
      if ((0x12000000000000U >> (uVar28 & 0x3f) & 1) == 0) {
        if ((0x24000000000000U >> (uVar28 & 0x3f) & 1) != 0) {
          lVar24 = 8;
          bVar5 = true;
          format = Format_Grayscale8;
          local_94 = 0;
          goto LAB_0029628d;
        }
        if ((0x48000000000000U >> (uVar28 & 0x3f) & 1) == 0) goto LAB_0029683a;
        lVar24 = 0x20;
        bVar4 = true;
        format = Format_RGB32;
        local_94 = 0;
        bVar5 = false;
      }
      else {
        bVar5 = false;
        lVar24 = 1;
        local_94 = 1;
        format = Format_Mono;
LAB_0029628d:
        bVar4 = false;
      }
      bVar6 = QImageIOHandler::allocateImage(size,format,image);
      if (bVar6) {
        lVar21 = (long)iVar26;
        lVar24 = lVar24 * lVar21 + 7;
        puVar18 = (uchar *)0x0;
        puVar13 = (uchar *)(lVar24 / 8);
        local_98 = (quint16)uVar3;
        if (bVar2 < 0x34) {
          local_40.rgba._0_1_ = 1;
          puVar18 = (uchar *)0x0;
          lVar24 = lVar24 / 0x20;
          i_00 = 0;
          uVar28 = 1;
          while ((i_00 < iVar7 && ((uVar28 & 1) != 0))) {
            puVar19 = QImage::scanLine(image,i_00);
            puVar30 = puVar13;
            iVar10 = iVar26;
            if (local_94 == 0) {
              if (bVar5) {
                puVar30 = (uchar *)0x0;
                if (uVar3 == 0xff) {
                  while ((puVar13 != puVar30 && ((uVar28 & 1) != 0))) {
                    iVar10 = read_pbm_int(d,(bool *)&local_40,-1);
                    puVar19[(long)puVar30] = (uchar)iVar10;
                    puVar30 = puVar30 + 1;
                    uVar28 = local_40.rgba & 0xff;
                  }
                }
                else {
                  while ((puVar13 != puVar30 && ((uVar28 & 1) != 0))) {
                    uVar22 = read_pbm_int(d,(bool *)&local_40,-1);
                    puVar19[(long)puVar30] =
                         (uchar)((long)(ulong)((uVar22 & 0xffff) * 0xff) / (long)(int)uVar3);
                    puVar30 = puVar30 + 1;
                    uVar28 = local_40.rgba & 0xff;
                  }
                }
              }
              else if (uVar3 == 0xff) {
                lVar21 = 0;
                while ((lVar24 != lVar21 && ((uVar28 & 1) != 0))) {
                  iVar10 = read_pbm_int(d,(bool *)&local_40,-1);
                  uVar22 = read_pbm_int(d,(bool *)&local_40,-1);
                  uVar9 = read_pbm_int(d,(bool *)&local_40,-1);
                  *(uint *)(puVar19 + lVar21 * 4) =
                       uVar9 & 0xff | (uVar22 & 0xff) << 8 | iVar10 << 0x10 | 0xff000000;
                  lVar21 = lVar21 + 1;
                  puVar18 = puVar19;
                  uVar28 = local_40.rgba & 0xff;
                }
              }
              else {
                lVar21 = 0;
                while ((lVar24 != lVar21 && ((uVar28 & 1) != 0))) {
                  iVar10 = read_pbm_int(d,(bool *)&local_40,-1);
                  iVar27 = read_pbm_int(d,(bool *)&local_40,-1);
                  iVar11 = read_pbm_int(d,(bool *)&local_40,-1);
                  QVar12 = scale_pbm_color(local_98,(quint16)iVar10,(quint16)iVar27,(quint16)iVar11)
                  ;
                  *(QRgb *)(puVar19 + lVar21 * 4) = QVar12;
                  lVar21 = lVar21 + 1;
                  puVar18 = puVar19;
                  uVar28 = local_40.rgba & 0xff;
                }
              }
            }
            else {
              while ((puVar30 != (uchar *)0x0 && ((uVar28 & 1) != 0))) {
                uVar22 = 0;
                for (iVar27 = 0; iVar27 != 8; iVar27 = iVar27 + 1) {
                  uVar22 = uVar22 * 2;
                  if (iVar27 < iVar10) {
                    uVar9 = read_pbm_int(d,(bool *)&local_40,1);
                    uVar22 = uVar22 | uVar9 & 1;
                  }
                }
                *puVar19 = (uchar)uVar22;
                puVar19 = puVar19 + 1;
                puVar30 = puVar30 + -1;
                iVar10 = iVar10 + -8;
                uVar28 = local_40.rgba & 0xff;
              }
            }
            i_00 = i_00 + 1;
          }
          if ((local_94 & (byte)uVar28) == 0) {
            if ((uVar28 & 1) != 0) goto LAB_0029682a;
            goto LAB_0029683a;
          }
LAB_002967fd:
          QImage::setColorCount(image,2);
          QImage::setColor(image,0,0xffffffff);
          QImage::setColor(image,1,0xff000000);
        }
        else {
          if (bVar4) {
            uVar28 = (ulong)(int)(((uint)(0xff < (int)uVar3) * 3 + 3) * iVar26);
            pbVar14 = (byte *)operator_new__(uVar28);
            iVar26 = 0;
            if (iVar7 < 1) {
              iVar7 = iVar26;
            }
            for (; iVar26 != iVar7; iVar26 = iVar26 + 1) {
              uVar15 = QIODevice::read((char *)d,(longlong)pbVar14);
              if (uVar15 != uVar28) {
                operator_delete__(pbVar14);
                goto LAB_0029683a;
              }
              puVar16 = (uint *)QImage::scanLine(image,iVar26);
              puVar1 = puVar16 + lVar21;
              pbVar25 = pbVar14;
              for (; puVar16 < puVar1; puVar16 = puVar16 + 1) {
                bVar2 = *pbVar25;
                if ((int)uVar3 < 0x100) {
                  puVar18 = (uchar *)0x0;
                  if (uVar3 == 0xff) {
                    uVar8 = ((uint)pbVar25[2] + ((uint)pbVar25[1] << 8 | (uint)bVar2 << 0x10)) -
                            0x1000000;
                  }
                  else {
                    uVar8 = scale_pbm_color(local_98,(ushort)bVar2,(ushort)pbVar25[1],
                                            (ushort)pbVar25[2]);
                  }
                  *puVar16 = uVar8;
                  lVar24 = 3;
                }
                else {
                  gv = *(ushort *)(pbVar25 + 2) << 8 | *(ushort *)(pbVar25 + 2) >> 8;
                  bv = *(ushort *)(pbVar25 + 4) << 8 | *(ushort *)(pbVar25 + 4) >> 8;
                  puVar18 = (uchar *)(ulong)bv;
                  if (uVar3 == 0xffff) {
                    puVar18 = (uchar *)0x0;
                    local_40.rgba =
                         (ulong)CONCAT24(bv,CONCAT22(gv,CONCAT11(bVar2,pbVar25[1]))) |
                         0xffff000000000000;
                    uVar8 = QRgba64::toArgb32(&local_40);
                  }
                  else {
                    uVar8 = scale_pbm_color(local_98,CONCAT11(bVar2,pbVar25[1]),gv,bv);
                  }
                  *puVar16 = uVar8;
                  lVar24 = 6;
                }
                pbVar25 = pbVar25 + lVar24;
              }
            }
            operator_delete__(pbVar14);
          }
          else {
            iVar26 = 0;
            if (iVar7 < 1) {
              iVar7 = iVar26;
            }
            puVar18 = (uchar *)0x0;
            if ((bool)(0xff < (int)uVar3 & bVar5)) {
              puVar17 = (ushort *)operator_new__(lVar21 * 2);
              for (iVar26 = 0; iVar26 != iVar7; iVar26 = iVar26 + 1) {
                uVar28 = QIODevice::read((char *)d,(longlong)puVar17);
                if (uVar28 != lVar21 * 2) {
                  operator_delete__(puVar17);
                  goto LAB_0029683a;
                }
                puVar18 = QImage::scanLine(image,iVar26);
                puVar13 = puVar18 + lVar21;
                puVar29 = puVar17;
                for (; puVar18 < puVar13; puVar18 = puVar18 + 1) {
                  *puVar18 = (uchar)(((uint)(ushort)(*puVar29 << 8 | *puVar29 >> 8) * 0xff) / uVar3)
                  ;
                  puVar29 = puVar29 + 1;
                }
              }
              operator_delete__(puVar17);
            }
            else {
              puVar30 = (uchar *)0x0;
              if (0 < (long)puVar13) {
                puVar30 = puVar13;
              }
              for (; iVar26 != iVar7; iVar26 = iVar26 + 1) {
                puVar19 = QImage::scanLine(image,iVar26);
                puVar20 = (uchar *)QIODevice::read((char *)d,(longlong)puVar19);
                if (puVar20 != puVar13) goto LAB_0029683a;
                if ((bool)((int)uVar3 < 0xff & bVar5)) {
                  for (puVar18 = (uchar *)0x0; puVar30 != puVar18; puVar18 = puVar18 + 1) {
                    puVar19[(long)puVar18] =
                         (uchar)((long)(ulong)((uint)puVar19[(long)puVar18] * 0xff) /
                                (long)(int)uVar3);
                  }
                }
              }
            }
          }
          if (local_94 != 0) goto LAB_002967fd;
        }
LAB_0029682a:
        uVar28 = CONCAT71((int7)((ulong)puVar18 >> 8),1);
        SVar23 = Ready;
        goto LAB_0029683d;
      }
    }
LAB_0029683a:
    uVar28 = 0;
    SVar23 = Error;
  }
  else {
    uVar28 = 0;
  }
LAB_0029683d:
  this->state = SVar23;
LAB_00296841:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar28 & 0xffffffff;
}

Assistant:

bool QPpmHandler::read(QImage *image)
{
    if (state == Error)
        return false;

    if (state == Ready && !readHeader()) {
        state = Error;
        return false;
    }

    if (!read_pbm_body(device(), type, width, height, mcc, image)) {
        state = Error;
        return false;
    }

    state = Ready;
    return true;
}